

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_resolveFlattenNonCircularImportsUnits_Test::TestBody
          (ModelFlattening_resolveFlattenNonCircularImportsUnits_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_308 [8];
  Message local_300 [8];
  unsigned_long local_2f8 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar;
  ModelPtr flatModel;
  AssertHelper local_2a8 [8];
  Message local_2a0 [15];
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [32];
  undefined1 local_230 [8];
  UnitsPtr importedUnit;
  string local_218 [32];
  undefined1 local_1f8 [8];
  ImportSourcePtr importSource;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [8];
  UnitsPtr perBecquerel;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [32];
  undefined1 local_138 [8];
  UnitsPtr fancyUnits;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  UnitsPtr unitsWithImportedUnit;
  string local_98 [32];
  undefined1 local_78 [8];
  ModelPtr importModel;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ImporterPtr importer;
  ModelFlattening_resolveFlattenNonCircularImportsUnits_Test *this_local;
  
  libcellml::Importer::create((bool)((char)&model + '\b'));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"model",&local_51);
  libcellml::Model::create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"importModel",
             (allocator<char> *)
             ((long)&unitsWithImportedUnit.
                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::Model::create((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&unitsWithImportedUnit.
                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"one_imported_unit",&local_d1);
  libcellml::Units::create((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"metre",&local_f9);
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"importedUnit",
             (allocator<char> *)
             ((long)&fancyUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fancyUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"fancyUnits",&local_159);
  libcellml::Units::create((string *)local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"per_becquerel",
             (allocator<char> *)
             ((long)&perBecquerel.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&perBecquerel.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"per_becquerel",&local_1b9);
  libcellml::Units::create((string *)local_198);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"",
             (allocator<char> *)
             ((long)&importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((StandardUnit)peVar3,-1.0,(string *)0x1);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_78);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_78);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  libcellml::ImportSource::create();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"here.cellml",
             (allocator<char> *)
             ((long)&importedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1f8);
  libcellml::ImportSource::setModel((shared_ptr *)peVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_250,"importedUnit",&local_251);
  libcellml::Units::create((string *)local_230);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"fancyUnits",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_230);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_291 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_290,"model->hasUnresolvedImports()","true");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x38e,pcVar6);
    testing::internal::AssertHelper::operator=(local_2a8,local_2a0);
    testing::internal::AssertHelper::~AssertHelper(local_2a8);
    std::__cxx11::string::~string
              ((string *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  local_2f8[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_2f8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2e8,"size_t(0)","importer->issueCount()",local_2f8 + 1,
             local_2f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar2) {
    testing::Message::Message(local_300);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x391,pcVar6);
    testing::internal::AssertHelper::operator=(local_308,local_300);
    testing::internal::AssertHelper::~AssertHelper(local_308);
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_230);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_1f8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_198);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_138);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_b0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_78);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenNonCircularImportsUnits)
{
    auto importer = libcellml::Importer::create();
    auto model = libcellml::Model::create("model");
    auto importModel = libcellml::Model::create("importModel");

    auto unitsWithImportedUnit = libcellml::Units::create("one_imported_unit");
    unitsWithImportedUnit->addUnit("metre");
    unitsWithImportedUnit->addUnit("importedUnit");

    auto fancyUnits = libcellml::Units::create("fancyUnits");
    fancyUnits->addUnit("per_becquerel");

    auto perBecquerel = libcellml::Units::create("per_becquerel");
    perBecquerel->addUnit(libcellml::Units::StandardUnit::BECQUEREL, -1.0);

    importModel->addUnits(fancyUnits);
    importModel->addUnits(perBecquerel);

    auto importSource = libcellml::ImportSource::create();
    importSource->setUrl("here.cellml");
    importSource->setModel(importModel);

    auto importedUnit = libcellml::Units::create("importedUnit");
    importedUnit->setImportReference("fancyUnits");
    importedUnit->setImportSource(importSource);

    model->addUnits(unitsWithImportedUnit);
    model->addUnits(importedUnit);

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(0), importer->issueCount());
}